

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

void DumpLiteral(SQObjectPtr *o)

{
  SQObjectType SVar1;
  SQChar *pSVar2;
  char *pcVar3;
  char *__format;
  
  SVar1 = (o->super_SQObject)._type;
  if ((int)SVar1 < 0x5000004) {
    if (SVar1 == OT_BOOL) {
      pcVar3 = "true";
      if ((o->super_SQObject)._unVal.pTable == (SQTable *)0x0) {
        pcVar3 = "false";
      }
      __format = "%s";
    }
    else {
      if (SVar1 != OT_INTEGER) goto LAB_00114753;
      pcVar3 = (char *)(o->super_SQObject)._unVal.pTable;
      __format = "{%lld}";
    }
  }
  else {
    if (SVar1 == OT_FLOAT) {
      printf("{%f}",(double)(o->super_SQObject)._unVal.fFloat);
      return;
    }
    if (SVar1 != OT_STRING) {
LAB_00114753:
      pSVar2 = GetTypeName(o);
      printf("(%s %p)",pSVar2,(o->super_SQObject)._unVal.pTable);
      return;
    }
    pcVar3 = (char *)&((o->super_SQObject)._unVal.pTable)->_firstfree;
    __format = "\"%s\"";
  }
  printf(__format,pcVar3);
  return;
}

Assistant:

void DumpLiteral(SQObjectPtr &o)
{
    switch(sq_type(o)){
        case OT_STRING: scprintf(_SC("\"%s\""),_stringval(o));break;
        case OT_FLOAT: scprintf(_SC("{%f}"),_float(o));break;
        case OT_INTEGER: scprintf(_SC("{") _PRINT_INT_FMT _SC("}"),_integer(o));break;
        case OT_BOOL: scprintf(_SC("%s"),_integer(o)?_SC("true"):_SC("false"));break;
        default: scprintf(_SC("(%s %p)"),GetTypeName(o),(void*)_rawval(o));break; break; //shut up compiler
    }
}